

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

void __thiscall glslang::TPpContext::pop_include(TPpContext *this)

{
  IncludeResult *pIVar1;
  _Elt_pointer ppIVar2;
  
  ppIVar2 = (this->includeStack).c.
            super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppIVar2 ==
      (this->includeStack).c.
      super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppIVar2 = (this->includeStack).c.
              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pIVar1 = ppIVar2[-1];
  std::
  deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
  ::pop_back(&(this->includeStack).c);
  (*this->includer->_vptr_Includer[2])(this->includer,pIVar1);
  std::__cxx11::string::_M_assign((string *)&this->currentSourceFile);
  return;
}

Assistant:

void pop_include()
    {
        TShader::Includer::IncludeResult* include = includeStack.top();
        includeStack.pop();
        includer.releaseInclude(include);
        if (includeStack.empty()) {
            currentSourceFile = rootFileName;
        } else {
            currentSourceFile = includeStack.top()->headerName;
        }
    }